

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsConstructObject(JsValueRef function,JsValueRef *args,ushort cargs,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  JsrtContext *pJVar6;
  RecyclableObject *pRVar7;
  ulong uVar8;
  Var pvVar9;
  JavascriptFunction *v;
  undefined4 *puVar10;
  undefined1 *aValue;
  JsErrorCode JVar11;
  ulong uVar12;
  void *unaff_retaddr;
  Arguments local_c8;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_38;
  char local_31;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar6 = JsrtContext::GetCurrent();
  JVar11 = JsErrorNoCurrentContext;
  if (pJVar6 == (JsrtContext *)0x0) goto LAB_003808fc;
  scriptContext = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_38,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTConstructCall
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,function,(uint)cargs,
               args);
  }
  JVar11 = JsErrorInvalidArgument;
  if (((ulong)function >> 0x30 == 0 && function != (JsValueRef)0x0) &&
     (bVar4 = Js::VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)function), bVar4)) {
    pRVar7 = Js::VarTo<Js::RecyclableObject>(function);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      JVar11 = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0038085d;
      function = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
    }
    if (result == (JsValueRef *)0x0) {
      JVar11 = JsErrorNullArgument;
    }
    else {
      *result = (JsValueRef)0x0;
      JVar11 = JsErrorInvalidArgument;
      if (args != (JsValueRef *)0x0 && cargs != 0) {
        aValue = (undefined1 *)*args;
        JVar11 = JsErrorInvalidArgument;
        local_31 = '\x01';
        uVar8 = (ulong)cargs;
        if (aValue != (undefined1 *)0x0) {
          uVar12 = 1;
          do {
            if (aValue < &DAT_1000000000000) {
              pRVar7 = Js::VarTo<Js::RecyclableObject>(aValue);
              pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                       ).scriptContext.ptr;
              if (pSVar1 == scriptContext) goto LAB_00380746;
              if (pSVar1->threadContext == scriptContext->threadContext) {
                pvVar9 = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
                args[uVar12 - 1] = pvVar9;
                goto LAB_00380746;
              }
LAB_00380769:
              JVar11 = JsErrorWrongRuntime;
              break;
            }
LAB_00380746:
            if (uVar8 == uVar12) {
              local_31 = uVar12 < uVar8;
              goto LAB_00380769;
            }
            aValue = (undefined1 *)args[uVar12];
            uVar12 = uVar12 + 1;
          } while (aValue != (undefined1 *)0x0);
        }
        if (local_31 == '\0') {
          v = Js::VarTo<Js::JavascriptFunction>(function);
          local_c8.Info = (Type)(uVar8 | 0x1000000);
          pTVar2 = scriptContext->threadContext;
          bVar4 = pTVar2->reentrancySafeOrHandled;
          pTVar2->reentrancySafeOrHandled = true;
          local_c8.Values = args;
          pvVar9 = Js::JavascriptFunction::CallAsConstructor
                             (v,(Var)0x0,&local_c8,scriptContext,(AuxArray<unsigned_int> *)0x0);
          *result = pvVar9;
          pTVar2->reentrancySafeOrHandled = bVar4;
          if ((pvVar9 != (Var)0x0) &&
             (BVar5 = Js::CrossSite::NeedMarshalVar(pvVar9,scriptContext), BVar5 != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                               ,0xb4d,
                               "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                               ,
                               "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                              );
            if (!bVar4) goto LAB_00380ba1;
            *puVar10 = 0;
          }
          JVar11 = JsNoError;
          if (scriptContext->TTDShouldPerformRecordAction == true) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
        }
      }
    }
  }
LAB_0038085d:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if ((((JVar11 & 0x6ffff) == JsErrorOutOfMemory) ||
      (((JVar11 - JsErrorNoCurrentContext < 7 &&
        ((0x43U >> (JVar11 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar11 == JsErrorFatal)
       ))) || (JVar11 == JsErrorScriptTerminated)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar4) {
LAB_00380ba1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_38);
LAB_003808fc:
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar11;
  }
  return JVar11;
}

Assistant:

CHAKRA_API JsConstructObject(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTConstructCall, function, cargs, args);

        VALIDATE_INCOMING_FUNCTION(function, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        if (cargs == 0 || args == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        for (int index = 0; index < cargs; index++)
        {
            VALIDATE_INCOMING_REFERENCE(args[index], scriptContext);
        }

        Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(function);
        Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, cargs);
        Js::Arguments jsArgs(callInfo, reinterpret_cast<Js::Var *>(args));

        //
        //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
        //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
        //

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            *result = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}